

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3VdbeHalt(Vdbe *p)

{
  byte *pbVar1;
  u8 uVar2;
  ushort uVar3;
  sqlite3 *db;
  VdbeFrame *pVVar4;
  VTable **ppVVar5;
  sqlite3_vtab *pVtab;
  _func_int_sqlite3_vtab_ptr *p_Var6;
  Btree *pBVar7;
  Pager *pPVar8;
  sqlite3_vfs *pVfs;
  long lVar9;
  char *z;
  bool bVar10;
  bool bVar11;
  sqlite3_file *pFile;
  byte bVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  VdbeFrame *pFrame;
  uint uVar17;
  char *pcVar18;
  int iVar19;
  long lVar20;
  long lVar21;
  VdbeFrame *pDel;
  long lVar22;
  uint local_48;
  int res;
  sqlite3_file *pMaster;
  long local_38;
  
  if (p->magic != 0x2df20da3) {
    return 0;
  }
  db = p->db;
  if (db->mallocFailed != '\0') {
    p->rc = 7;
  }
  pVVar4 = p->pFrame;
  if (p->pFrame != (VdbeFrame *)0x0) {
    do {
      pFrame = pVVar4;
      pVVar4 = pFrame->pParent;
    } while (pVVar4 != (VdbeFrame *)0x0);
    sqlite3VdbeFrameRestore(pFrame);
    p->pFrame = (VdbeFrame *)0x0;
    p->nFrame = 0;
  }
  closeCursorsInFrame(p);
  if (p->aMem != (Mem *)0x0) {
    releaseMemArray(p->aMem,p->nMem);
  }
  while (pVVar4 = p->pDelFrame, pVVar4 != (VdbeFrame *)0x0) {
    p->pDelFrame = pVVar4->pParent;
    iVar19 = pVVar4->nChildMem;
    for (lVar21 = 0; lVar21 < pVVar4->nChildCsr; lVar21 = lVar21 + 1) {
      sqlite3VdbeFreeCursor(pVVar4->v,(VdbeCursor *)(&pVVar4[1].v)[(long)iVar19 * 7 + lVar21]);
    }
    releaseMemArray((Mem *)(pVVar4 + 1),pVVar4->nChildMem);
    sqlite3VdbeDeleteAuxData(pVVar4->v->db,&pVVar4->pAuxData,-1,0);
    sqlite3DbFreeNN(pVVar4->v->db,pVVar4);
  }
  if (p->pAuxData != (AuxData *)0x0) {
    sqlite3VdbeDeleteAuxData(p->db,&p->pAuxData,-1,0);
  }
  if (p->pc < 0) goto LAB_00229aa4;
  if ((p->field_0xc2 & 1) != 0) {
    sqlite3VdbeEnter(p);
    uVar16 = p->rc;
    bVar11 = false;
    bVar10 = true;
    bVar12 = (byte)uVar16;
    if ((bVar12 < 0xe) && ((0x2680U >> (uVar16 & 0x1f) & 1) != 0)) {
      if (bVar12 != 9 || -1 < (char)*(ushort *)&p->field_0xc1) {
        if (((bVar12 == 0xd) || ((uVar16 & 0xff) == 7)) && ((*(ushort *)&p->field_0xc1 & 0x40) != 0)
           ) {
          iVar19 = 2;
          bVar11 = true;
          bVar10 = false;
        }
        else {
          sqlite3RollbackAll(db,0x204);
          sqlite3CloseSavepoints(db);
          db->autoCommit = '\x01';
          p->nChange = 0;
          uVar16 = p->rc;
          iVar19 = 0;
          bVar11 = true;
          bVar10 = true;
        }
        goto LAB_0022941f;
      }
      bVar10 = true;
      iVar19 = 0;
      bVar11 = true;
    }
    else {
      iVar19 = 0;
LAB_0022941f:
      if (uVar16 == 0) {
        sqlite3VdbeCheckFk(p,0);
      }
    }
    if (((db->nVTrans < 1) || (db->aVTrans != (VTable **)0x0)) &&
       ((db->autoCommit != '\0' && (db->nVdbeWrite == (uint)((p->field_0xc1 & 0x80) == 0))))) {
      if ((p->rc == 0) || (!bVar11 && p->errorAction == '\x03')) {
        iVar13 = sqlite3VdbeCheckFk(p,1);
        if (iVar13 == 0) {
          ppVVar5 = db->aVTrans;
          db->aVTrans = (VTable **)0x0;
          iVar13 = 0;
          for (lVar21 = 0; (iVar13 == 0 && (lVar21 < db->nVTrans)); lVar21 = lVar21 + 1) {
            pVtab = ppVVar5[lVar21]->pVtab;
            iVar13 = 0;
            if ((pVtab != (sqlite3_vtab *)0x0) &&
               (p_Var6 = pVtab->pModule->xSync, p_Var6 != (_func_int_sqlite3_vtab_ptr *)0x0)) {
              iVar13 = (*p_Var6)(pVtab);
              sqlite3VtabImportErrmsg(p,pVtab);
            }
          }
          db->aVTrans = ppVVar5;
          lVar20 = 0;
          lVar21 = 0;
          bVar10 = false;
          iVar14 = 0;
LAB_0022956f:
          if (iVar13 == 0) {
            if (lVar21 < db->nDb) goto code_r0x00229581;
            if ((bVar10) && (db->xCommitCallback != (_func_int_void_ptr *)0x0)) {
              iVar15 = (*db->xCommitCallback)(db->pCommitArg);
              iVar13 = 0x213;
              if (iVar15 != 0) goto LAB_002299cc;
            }
            pPVar8 = db->aDb->pBt->pBt->pPager;
            uVar2 = pPVar8->memDb;
            if (uVar2 == '\0') {
              pcVar18 = pPVar8->zFilename;
            }
            else {
              pcVar18 = "";
            }
            iVar13 = sqlite3Strlen30(pcVar18);
            if ((iVar13 == 0) || (iVar14 < 2)) {
              lVar21 = 8;
              iVar13 = 0;
              for (lVar20 = 0; (iVar13 == 0 && (lVar20 < db->nDb)); lVar20 = lVar20 + 1) {
                pBVar7 = *(Btree **)((long)&db->aDb->zDbSName + lVar21);
                if (pBVar7 == (Btree *)0x0) {
                  iVar13 = 0;
                }
                else {
                  iVar13 = sqlite3BtreeCommitPhaseOne(pBVar7,(char *)0x0);
                }
                lVar21 = lVar21 + 0x20;
              }
              lVar21 = 8;
              lVar20 = 0;
              while (iVar13 == 0) {
                if (db->nDb <= lVar20) goto LAB_00229afe;
                pBVar7 = *(Btree **)((long)&db->aDb->zDbSName + lVar21);
                if (pBVar7 == (Btree *)0x0) {
                  iVar13 = 0;
                }
                else {
                  iVar13 = sqlite3BtreeCommitPhaseTwo(pBVar7,0);
                }
                lVar20 = lVar20 + 1;
                lVar21 = lVar21 + 0x20;
              }
              goto LAB_002299b0;
            }
            if (uVar2 == '\0') {
              pcVar18 = pPVar8->zFilename;
            }
            else {
              pcVar18 = "";
            }
            pVfs = db->pVfs;
            pMaster = (sqlite3_file *)0x0;
            uVar16 = sqlite3Strlen30(pcVar18);
            pcVar18 = sqlite3MPrintf(db,"%s-mjXXXXXX9XXz",pcVar18);
            if (pcVar18 != (char *)0x0) {
              uVar17 = 0;
              goto LAB_0022972c;
            }
            iVar13 = 7;
          }
          goto LAB_002299b0;
        }
        iVar13 = 0x313;
        if ((p->field_0xc1 & 0x80) != 0) {
          sqlite3VdbeLeave(p);
          return 1;
        }
        goto LAB_002299cc;
      }
      goto LAB_002299d0;
    }
    if (!bVar10) goto LAB_002299e6;
    iVar19 = 1;
    if ((p->rc == 0) || (p->errorAction == '\x03')) {
LAB_002299eb:
      iVar13 = sqlite3VdbeCloseStatement(p,iVar19);
      if (iVar13 == 0) goto LAB_00229a49;
      if (p->rc == 0 || (char)p->rc == '\x13') {
        p->rc = iVar13;
        sqlite3DbFree(db,p->zErrMsg);
        p->zErrMsg = (char *)0x0;
      }
      sqlite3RollbackAll(db,0x204);
      sqlite3CloseSavepoints(db);
    }
    else {
      if (p->errorAction == '\x02') {
        iVar19 = 2;
        goto LAB_002299eb;
      }
      sqlite3RollbackAll(db,0x204);
      sqlite3CloseSavepoints(db);
      iVar19 = 0;
    }
    db->autoCommit = '\x01';
    p->nChange = 0;
    goto LAB_00229a49;
  }
  goto LAB_00229a77;
code_r0x00229581:
  pBVar7 = *(Btree **)((long)&db->aDb->pBt + lVar20);
  iVar13 = 0;
  if ((pBVar7 != (Btree *)0x0) && (pBVar7->inTrans == '\x02')) {
    sqlite3BtreeEnter(pBVar7);
    pPVar8 = pBVar7->pBt->pPager;
    if ((&db->aDb->safety_level)[lVar20] != '\x01') {
      iVar14 = (~(uint)(0x34L >> (pPVar8->journalMode & 0x3f)) & 1) + iVar14;
    }
    iVar13 = sqlite3PagerExclusiveLock(pPVar8);
    sqlite3BtreeLeave(pBVar7);
    bVar10 = true;
  }
  lVar21 = lVar21 + 1;
  lVar20 = lVar20 + 0x20;
  goto LAB_0022956f;
code_r0x002298de:
  pBVar7 = *(Btree **)((long)&db->aDb->zDbSName + lVar21);
  if (pBVar7 == (Btree *)0x0) {
    iVar13 = 0;
  }
  else {
    iVar13 = sqlite3BtreeCommitPhaseOne(pBVar7,pcVar18);
  }
  lVar20 = lVar20 + 1;
  lVar21 = lVar21 + 0x20;
  goto LAB_002298d0;
  while( true ) {
    sqlite3_randomness(4,&local_48);
    sqlite3_snprintf(0xd,pcVar18 + uVar16,"-mj%06X9%02X",(ulong)(local_48 >> 8));
    iVar13 = (*pVfs->xAccess)(pVfs,pcVar18,0,&res);
    if ((iVar13 != 0) || (uVar17 = uVar17 + 1, res == 0)) break;
LAB_0022972c:
    if (uVar17 != 0) {
      if (100 < uVar17) {
        sqlite3_log(0xd,"MJ delete: %s",pcVar18);
        (*pVfs->xDelete)(pVfs,pcVar18,0);
        goto LAB_002297e3;
      }
      if (uVar17 == 1) {
        sqlite3_log(0xd,"MJ collide: %s",pcVar18);
      }
    }
  }
  if (iVar13 == 0) {
LAB_002297e3:
    iVar13 = sqlite3OsOpenMalloc(pVfs,pcVar18,&pMaster,0x4016,(int *)0x0);
    pFile = pMaster;
    if (iVar13 == 0) {
      lVar22 = 0;
      lVar21 = 8;
      for (lVar20 = 0; lVar20 < db->nDb; lVar20 = lVar20 + 1) {
        lVar9 = *(long *)((long)&db->aDb->zDbSName + lVar21);
        if (((lVar9 != 0) && (*(char *)(lVar9 + 0x10) == '\x02')) &&
           (z = *(char **)(**(long **)(lVar9 + 8) + 0xd8), z != (char *)0x0)) {
          local_38 = lVar21;
          iVar13 = sqlite3Strlen30(z);
          iVar13 = (*pFile->pMethods->xWrite)(pFile,z,iVar13 + 1,lVar22);
          uVar16 = sqlite3Strlen30(z);
          if (iVar13 != 0) goto LAB_0022998f;
          lVar22 = lVar22 + (ulong)uVar16 + 1;
          lVar21 = local_38;
        }
        lVar21 = lVar21 + 0x20;
      }
      uVar16 = (*pFile->pMethods->xDeviceCharacteristics)(pFile);
      if (((uVar16 >> 10 & 1) == 0) && (iVar13 = (*pFile->pMethods->xSync)(pFile,2), iVar13 != 0)) {
LAB_0022998f:
        sqlite3OsCloseFree(pFile);
        (*pVfs->xDelete)(pVfs,pcVar18,0);
      }
      else {
        lVar20 = 0;
        lVar21 = 8;
        iVar13 = 0;
LAB_002298d0:
        if (iVar13 == 0) {
          if (lVar20 < db->nDb) goto code_r0x002298de;
          sqlite3OsCloseFree(pFile);
          iVar13 = (*pVfs->xDelete)(pVfs,pcVar18,1);
          sqlite3DbFreeNN(db,pcVar18);
          if (iVar13 == 0) {
            if (sqlite3Hooks_0 != (code *)0x0) {
              (*sqlite3Hooks_0)();
            }
            lVar21 = 8;
            for (lVar20 = 0; lVar20 < db->nDb; lVar20 = lVar20 + 1) {
              pBVar7 = *(Btree **)((long)&db->aDb->zDbSName + lVar21);
              if (pBVar7 != (Btree *)0x0) {
                sqlite3BtreeCommitPhaseTwo(pBVar7,1);
              }
              lVar21 = lVar21 + 0x20;
            }
            if (sqlite3Hooks_1 != (code *)0x0) {
              (*sqlite3Hooks_1)();
            }
LAB_00229afe:
            sqlite3VtabCommit(db);
            db->nDeferredCons = 0;
            db->nDeferredImmCons = 0;
            pbVar1 = (byte *)((long)&db->flags + 2);
            *pbVar1 = *pbVar1 & 0x7b;
            goto LAB_002299de;
          }
          goto LAB_002299b0;
        }
        sqlite3OsCloseFree(pFile);
      }
    }
  }
  sqlite3DbFreeNN(db,pcVar18);
LAB_002299b0:
  if (iVar13 == 5) {
    if ((p->field_0xc1 & 0x80) != 0) {
      sqlite3VdbeLeave(p);
      return 5;
    }
    iVar13 = 5;
  }
LAB_002299cc:
  p->rc = iVar13;
LAB_002299d0:
  sqlite3RollbackAll(db,0);
  p->nChange = 0;
LAB_002299de:
  db->nStatement = 0;
LAB_002299e6:
  if (iVar19 != 0) goto LAB_002299eb;
  iVar19 = 0;
LAB_00229a49:
  if ((p->field_0xc1 & 0x10) != 0) {
    iVar13 = 0;
    if (iVar19 != 2) {
      iVar13 = p->nChange;
      db->nTotalChange = db->nTotalChange + iVar13;
    }
    db->nChange = iVar13;
    p->nChange = 0;
  }
  sqlite3VdbeLeave(p);
  if (p->pc < 0) goto LAB_00229aa4;
LAB_00229a77:
  db->nVdbeActive = db->nVdbeActive + -1;
  uVar3 = *(ushort *)&p->field_0xc1;
  if (-1 < (char)uVar3) {
    db->nVdbeWrite = db->nVdbeWrite + -1;
    uVar3 = *(ushort *)&p->field_0xc1;
  }
  if ((uVar3 >> 8 & 1) != 0) {
    db->nVdbeRead = db->nVdbeRead + -1;
  }
LAB_00229aa4:
  p->magic = 0x319c2973;
  if (db->mallocFailed == '\0') {
    iVar19 = (uint)(p->rc == 5) * 5;
  }
  else {
    p->rc = 7;
    iVar19 = 0;
  }
  return iVar19;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeHalt(Vdbe *p){
  int rc;                         /* Used to store transient return codes */
  sqlite3 *db = p->db;

  /* This function contains the logic that determines if a statement or
  ** transaction will be committed or rolled back as a result of the
  ** execution of this virtual machine. 
  **
  ** If any of the following errors occur:
  **
  **     SQLITE_NOMEM
  **     SQLITE_IOERR
  **     SQLITE_FULL
  **     SQLITE_INTERRUPT
  **
  ** Then the internal cache might have been left in an inconsistent
  ** state.  We need to rollback the statement transaction, if there is
  ** one, or the complete transaction if there is no statement transaction.
  */

  if( p->magic!=VDBE_MAGIC_RUN ){
    return SQLITE_OK;
  }
  if( db->mallocFailed ){
    p->rc = SQLITE_NOMEM_BKPT;
  }
  closeAllCursors(p);
  checkActiveVdbeCnt(db);

  /* No commit or rollback needed if the program never started or if the
  ** SQL statement does not read or write a database file.  */
  if( p->pc>=0 && p->bIsReader ){
    int mrc;   /* Primary error code from p->rc */
    int eStatementOp = 0;
    int isSpecialError;            /* Set to true if a 'special' error */

    /* Lock all btrees used by the statement */
    sqlite3VdbeEnter(p);

    /* Check for one of the special errors */
    mrc = p->rc & 0xff;
    isSpecialError = mrc==SQLITE_NOMEM || mrc==SQLITE_IOERR
                     || mrc==SQLITE_INTERRUPT || mrc==SQLITE_FULL;
    if( isSpecialError ){
      /* If the query was read-only and the error code is SQLITE_INTERRUPT, 
      ** no rollback is necessary. Otherwise, at least a savepoint 
      ** transaction must be rolled back to restore the database to a 
      ** consistent state.
      **
      ** Even if the statement is read-only, it is important to perform
      ** a statement or transaction rollback operation. If the error 
      ** occurred while writing to the journal, sub-journal or database
      ** file as part of an effort to free up cache space (see function
      ** pagerStress() in pager.c), the rollback is required to restore 
      ** the pager to a consistent state.
      */
      if( !p->readOnly || mrc!=SQLITE_INTERRUPT ){
        if( (mrc==SQLITE_NOMEM || mrc==SQLITE_FULL) && p->usesStmtJournal ){
          eStatementOp = SAVEPOINT_ROLLBACK;
        }else{
          /* We are forced to roll back the active transaction. Before doing
          ** so, abort any other statements this handle currently has active.
          */
          sqlite3RollbackAll(db, SQLITE_ABORT_ROLLBACK);
          sqlite3CloseSavepoints(db);
          db->autoCommit = 1;
          p->nChange = 0;
        }
      }
    }

    /* Check for immediate foreign key violations. */
    if( p->rc==SQLITE_OK ){
      sqlite3VdbeCheckFk(p, 0);
    }
  
    /* If the auto-commit flag is set and this is the only active writer 
    ** VM, then we do either a commit or rollback of the current transaction. 
    **
    ** Note: This block also runs if one of the special errors handled 
    ** above has occurred. 
    */
    if( !sqlite3VtabInSync(db) 
     && db->autoCommit 
     && db->nVdbeWrite==(p->readOnly==0) 
    ){
      if( p->rc==SQLITE_OK || (p->errorAction==OE_Fail && !isSpecialError) ){
        rc = sqlite3VdbeCheckFk(p, 1);
        if( rc!=SQLITE_OK ){
          if( NEVER(p->readOnly) ){
            sqlite3VdbeLeave(p);
            return SQLITE_ERROR;
          }
          rc = SQLITE_CONSTRAINT_FOREIGNKEY;
        }else{ 
          /* The auto-commit flag is true, the vdbe program was successful 
          ** or hit an 'OR FAIL' constraint and there are no deferred foreign
          ** key constraints to hold up the transaction. This means a commit 
          ** is required. */
          rc = vdbeCommit(db, p);
        }
        if( rc==SQLITE_BUSY && p->readOnly ){
          sqlite3VdbeLeave(p);
          return SQLITE_BUSY;
        }else if( rc!=SQLITE_OK ){
          p->rc = rc;
          sqlite3RollbackAll(db, SQLITE_OK);
          p->nChange = 0;
        }else{
          db->nDeferredCons = 0;
          db->nDeferredImmCons = 0;
          db->flags &= ~SQLITE_DeferFKs;
          sqlite3CommitInternalChanges(db);
        }
      }else{
        sqlite3RollbackAll(db, SQLITE_OK);
        p->nChange = 0;
      }
      db->nStatement = 0;
    }else if( eStatementOp==0 ){
      if( p->rc==SQLITE_OK || p->errorAction==OE_Fail ){
        eStatementOp = SAVEPOINT_RELEASE;
      }else if( p->errorAction==OE_Abort ){
        eStatementOp = SAVEPOINT_ROLLBACK;
      }else{
        sqlite3RollbackAll(db, SQLITE_ABORT_ROLLBACK);
        sqlite3CloseSavepoints(db);
        db->autoCommit = 1;
        p->nChange = 0;
      }
    }
  
    /* If eStatementOp is non-zero, then a statement transaction needs to
    ** be committed or rolled back. Call sqlite3VdbeCloseStatement() to
    ** do so. If this operation returns an error, and the current statement
    ** error code is SQLITE_OK or SQLITE_CONSTRAINT, then promote the
    ** current statement error code.
    */
    if( eStatementOp ){
      rc = sqlite3VdbeCloseStatement(p, eStatementOp);
      if( rc ){
        if( p->rc==SQLITE_OK || (p->rc&0xff)==SQLITE_CONSTRAINT ){
          p->rc = rc;
          sqlite3DbFree(db, p->zErrMsg);
          p->zErrMsg = 0;
        }
        sqlite3RollbackAll(db, SQLITE_ABORT_ROLLBACK);
        sqlite3CloseSavepoints(db);
        db->autoCommit = 1;
        p->nChange = 0;
      }
    }
  
    /* If this was an INSERT, UPDATE or DELETE and no statement transaction
    ** has been rolled back, update the database connection change-counter. 
    */
    if( p->changeCntOn ){
      if( eStatementOp!=SAVEPOINT_ROLLBACK ){
        sqlite3VdbeSetChanges(db, p->nChange);
      }else{
        sqlite3VdbeSetChanges(db, 0);
      }
      p->nChange = 0;
    }

    /* Release the locks */
    sqlite3VdbeLeave(p);
  }

  /* We have successfully halted and closed the VM.  Record this fact. */
  if( p->pc>=0 ){
    db->nVdbeActive--;
    if( !p->readOnly ) db->nVdbeWrite--;
    if( p->bIsReader ) db->nVdbeRead--;
    assert( db->nVdbeActive>=db->nVdbeRead );
    assert( db->nVdbeRead>=db->nVdbeWrite );
    assert( db->nVdbeWrite>=0 );
  }
  p->magic = VDBE_MAGIC_HALT;
  checkActiveVdbeCnt(db);
  if( db->mallocFailed ){
    p->rc = SQLITE_NOMEM_BKPT;
  }

  /* If the auto-commit flag is set to true, then any locks that were held
  ** by connection db have now been released. Call sqlite3ConnectionUnlocked() 
  ** to invoke any required unlock-notify callbacks.
  */
  if( db->autoCommit ){
    sqlite3ConnectionUnlocked(db);
  }

  assert( db->nVdbeActive>0 || db->autoCommit==0 || db->nStatement==0 );
  return (p->rc==SQLITE_BUSY ? SQLITE_BUSY : SQLITE_OK);
}